

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

HighsStatus normaliseHessian(HighsOptions *options,HighsHessian *hessian)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  uint num_entries;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  HighsInt iEl;
  int iVar10;
  size_type sVar11;
  HighsStatus HVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  size_type __n;
  size_type __new_size;
  double dVar19;
  vector<double,_std::allocator<double>_> column_value;
  vector<int,_std::allocator<int>_> column_index;
  vector<int,_std::allocator<int>_> qr_length;
  HighsHessian normalised;
  HighsHessian transpose;
  double local_160;
  double local_158;
  vector<double,_std::allocator<double>_> local_148;
  vector<int,_std::allocator<int>_> *local_130;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_108;
  HighsOptions *local_e8;
  double local_e0;
  HighsHessian local_d8;
  HighsHessian local_88;
  value_type_conflict1 local_38;
  
  uVar3 = hessian->dim_;
  uVar9 = (ulong)uVar3;
  __n = (size_type)(int)uVar3;
  __new_size = (size_type)
               (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[__n];
  if ((long)__new_size < 1) {
    HVar12 = kOk;
  }
  else {
    local_e8 = options;
    HighsHessian::HighsHessian(&local_88);
    local_88.dim_ = uVar3;
    std::vector<int,_std::allocator<int>_>::resize(&local_88.start_,__n + 1);
    std::vector<int,_std::allocator<int>_>::resize(&local_88.index_,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&local_88.value_,__new_size);
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d8.dim_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_108,__n,&local_d8.dim_);
    local_130 = &hessian->start_;
    piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar4[sVar11]] =
           local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar4[sVar11]] + 1;
      sVar11 = sVar11 + 1;
    } while (__new_size != sVar11);
    *local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    if (0 < (int)uVar3) {
      iVar10 = *local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        iVar10 = iVar10 + local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13];
        local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13 + 1] = iVar10;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    if (0 < (int)uVar3) {
      piVar4 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        lVar16 = (long)piVar4[uVar13];
        uVar15 = uVar13 + 1;
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          do {
            iVar10 = piVar5[lVar16];
            iVar14 = local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10];
            local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] = (int)uVar13;
            local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] = pdVar6[lVar16];
            local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10] =
                 local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10] + 1;
            lVar16 = lVar16 + 1;
          } while (lVar16 < piVar4[uVar15]);
        }
        uVar13 = uVar15;
      } while (uVar15 != uVar9);
    }
    *local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    if (0 < (int)uVar3) {
      iVar10 = *local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        iVar10 = iVar10 + local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13];
        local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13 + 1] = iVar10;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    HighsHessian::HighsHessian(&local_d8);
    local_d8.format_ = kSquare;
    local_d8.dim_ = uVar3;
    std::vector<int,_std::allocator<int>_>::resize(&local_d8.start_,__n + 1);
    std::vector<int,_std::allocator<int>_>::resize(&local_d8.index_,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&local_d8.value_,__new_size);
    local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&local_128,__n);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_148,__n,&local_38);
    *local_d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    if ((int)uVar3 < 1) {
      local_158 = 0.0;
      local_160 = 0.0;
      uVar18 = 0;
    }
    else {
      local_e0 = (double)(int)uVar3;
      local_158 = INFINITY;
      local_160 = 0.0;
      uVar18 = 0;
      iVar10 = 0;
      uVar13 = 0;
      do {
        piVar4 = (local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = (long)piVar4[uVar13];
        uVar15 = uVar13 + 1;
        uVar17 = 0;
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          piVar5 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar17 = 0;
          do {
            iVar14 = piVar5[lVar16 + uVar17];
            local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] = pdVar6[lVar16 + uVar17];
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar17] = iVar14;
            lVar1 = lVar16 + uVar17;
            uVar17 = uVar17 + 1;
          } while (lVar1 + 1 < (long)piVar4[uVar15]);
        }
        lVar16 = (long)local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
        if (local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13] <
            local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15]) {
          do {
            iVar14 = local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            dVar2 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar14];
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14] =
                   dVar2 + local_88.value_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar16];
            }
            else {
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14] =
                   local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar17] = iVar14;
              uVar17 = (ulong)((int)uVar17 + 1);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar15]);
        }
        num_entries = (uint)uVar17;
        uVar8 = iVar10 + num_entries;
        iVar14 = (int)__new_size;
        if (iVar14 < (int)uVar8) {
          uVar7 = iVar14 * 2;
          if (uVar8 != uVar7 && SBORROW4(uVar8,uVar7) == (int)(uVar8 + iVar14 * -2) < 0) {
            uVar7 = uVar8;
          }
          __new_size = (size_type)uVar7;
          std::vector<int,_std::allocator<int>_>::resize(&local_d8.index_,(long)(int)uVar7);
          std::vector<double,_std::allocator<double>_>::resize(&local_d8.value_,(long)(int)uVar7);
        }
        if (0 < (int)num_entries) {
          uVar13 = 0;
          do {
            dVar2 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13]] * 0.5;
            if (dVar2 == 0.0) {
              dVar2 = ABS(dVar2);
              dVar19 = dVar2;
              if (dVar2 <= local_160) {
                dVar19 = local_160;
              }
              if (local_158 <= dVar2) {
                dVar2 = local_158;
              }
              local_158 = dVar2;
              uVar18 = uVar18 + 1;
              dVar2 = 0.0;
              local_160 = dVar19;
            }
            local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar13]] = dVar2;
            uVar13 = uVar13 + 1;
          } while ((uVar17 & 0xffffffff) != uVar13);
        }
        dVar2 = (double)(int)num_entries / local_e0;
        uVar8 = uVar3;
        if (dVar2 < 0.1 && (int)uVar3 >= 0xb) {
          sortSetData(num_entries,&local_128,(HighsVarType *)0x0,(HighsVarType *)0x0);
          uVar8 = num_entries;
        }
        if (0 < (int)uVar8) {
          uVar13 = 0;
          do {
            if (0.1 <= dVar2 || (int)uVar3 < 0xb) {
              iVar14 = (int)uVar13;
            }
            else {
              iVar14 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
            }
            dVar19 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar14];
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              local_d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] = iVar14;
              local_d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] = dVar19;
              iVar10 = iVar10 + 1;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar14] = 0.0;
            }
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        local_d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = iVar10;
        uVar13 = uVar15;
      } while (uVar15 != uVar9);
    }
    if (uVar18 != 0) {
      highsLogUser(&(local_e8->super_HighsOptionsStruct).log_options,kWarning,
                   "Normalised Hessian contains %d |values| in [%g, %g] less than %g: ignored\n",
                   SUB84(local_158,0),local_160,0,(ulong)uVar18);
    }
    hessian->dim_ = local_d8.dim_;
    hessian->format_ = local_d8.format_;
    std::vector<int,_std::allocator<int>_>::operator=(local_130,&local_d8.start_);
    std::vector<int,_std::allocator<int>_>::operator=(&hessian->index_,&local_d8.index_);
    std::vector<double,_std::allocator<double>_>::operator=(&hessian->value_,&local_d8.value_);
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (int *)0x0) {
      operator_delete(local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    HVar12 = (HighsStatus)(uVar18 != 0);
  }
  return HVar12;
}

Assistant:

HighsStatus normaliseHessian(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Only relevant for a Hessian with format HessianFormat::kSquare
  assert(hessian.format_ == HessianFormat::kSquare);
  // Normalise the Hessian to be (Q + Q^T)/2, where Q is the matrix
  // supplied. This guarantees that what's used internally is
  // symmetric.
  //
  // So someone preferring to supply only the upper triangle would
  // have to double its values..
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  const HighsInt hessian_num_nz = hessian.start_[dim];
  if (hessian_num_nz <= 0) return HighsStatus::kOk;
  bool warning_found = false;

  HighsHessian transpose;
  transpose.dim_ = dim;
  transpose.start_.resize(dim + 1);
  transpose.index_.resize(hessian_num_nz);
  transpose.value_.resize(hessian_num_nz);
  // Form transpose of Hessian
  vector<HighsInt> qr_length;
  qr_length.assign(dim, 0);
  for (HighsInt iEl = 0; iEl < hessian_num_nz; iEl++)
    qr_length[hessian.index_[iEl]]++;

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt iRowEl = transpose.start_[iRow];
      transpose.index_[iRowEl] = iCol;
      transpose.value_[iRowEl] = hessian.value_[iEl];
      transpose.start_[iRow]++;
    }
  }

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  // Instantiate a square format Hessian in which to accumulate (Q + Q^T)/2
  HighsHessian normalised;
  normalised.format_ = HessianFormat::kSquare;
  HighsInt normalised_num_nz = 0;
  HighsInt normalised_size = hessian_num_nz;
  normalised.dim_ = dim;
  normalised.start_.resize(dim + 1);
  normalised.index_.resize(normalised_size);
  normalised.value_.resize(normalised_size);
  vector<double> column_value;
  vector<HighsInt> column_index;
  column_index.resize(dim);
  column_value.assign(dim, 0.0);
  const bool check_column_value_zero = false;
  const double small_matrix_value = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  normalised.start_[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt column_num_nz = 0;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      column_value[iRow] = hessian.value_[iEl];
      column_index[column_num_nz] = iRow;
      column_num_nz++;
    }
    for (HighsInt iEl = transpose.start_[iCol];
         iEl < transpose.start_[iCol + 1]; iEl++) {
      HighsInt iRow = transpose.index_[iEl];
      if (column_value[iRow]) {
        column_value[iRow] += transpose.value_[iEl];
      } else {
        column_value[iRow] = transpose.value_[iEl];
        column_index[column_num_nz] = iRow;
        column_num_nz++;
      }
    }
    if (normalised_num_nz + column_num_nz > normalised_size) {
      normalised_size =
          std::max(normalised_num_nz + column_num_nz, 2 * normalised_size);
      normalised.index_.resize(normalised_size);
      normalised.value_.resize(normalised_size);
    }
    // Halve the values, zeroing and accounting for any small ones
    for (HighsInt ix = 0; ix < column_num_nz; ix++) {
      HighsInt iRow = column_index[ix];
      double value = 0.5 * column_value[iRow];
      double abs_value = std::fabs(value);
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        value = 0;
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      column_value[iRow] = value;
    }
    // Decide whether to exploit sparsity in extracting the indices
    // and values of nonzeros
    const HighsInt kDimTolerance = 10;
    const double kDensityTolerance = 0.1;
    const double density = (1.0 * column_num_nz) / (1.0 * dim);
    HighsInt to_ix = dim;
    const bool exploit_sparsity =
        dim > kDimTolerance && density < kDensityTolerance;
    if (exploit_sparsity) {
      // Exploit sparsity
      to_ix = column_num_nz;
      sortSetData(column_num_nz, column_index, NULL, NULL);
    } else {
      to_ix = dim;
    }
    for (HighsInt ix = 0; ix < to_ix; ix++) {
      HighsInt iRow;
      if (exploit_sparsity) {
        iRow = column_index[ix];
      } else {
        iRow = ix;
      }
      double value = column_value[iRow];
      if (value) {
        normalised.index_[normalised_num_nz] = iRow;
        normalised.value_[normalised_num_nz] = value;
        normalised_num_nz++;
        column_value[iRow] = 0;
      }
    }
    if (check_column_value_zero) {
      for (HighsInt iRow = 0; iRow < dim; iRow++)
        assert(column_value[iRow] == 0);
    }
    normalised.start_[iCol + 1] = normalised_num_nz;
  }
  if (num_small_values) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Normalised Hessian contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] "
                 "less than %g: ignored\n",
                 num_small_values, min_small_value, max_small_value,
                 small_matrix_value);
    warning_found = true;
  }
  // Replace the Hessian by the normalised form
  hessian = normalised;
  assert(hessian.format_ == HessianFormat::kSquare);
  if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}